

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * CompileVmContinue(ExpressionContext *ctx,VmModule *module,ExprContinue *node)

{
  Allocator *pAVar1;
  int iVar2;
  VmBlock *label;
  undefined4 extraout_var;
  VmValue *pVVar3;
  
  if (node->closures != (ExprBase *)0x0) {
    CompileVm(ctx,module,node->closures);
  }
  label = GetLoopContinueBlock(module,*(uint *)&(node->super_ExprBase).field_0x2c);
  anon_unknown.dwarf_10d873::CreateJump(module,(node->super_ExprBase).source,&label->super_VmValue);
  iVar2 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0x98);
  pVVar3 = (VmValue *)CONCAT44(extraout_var,iVar2);
  pAVar1 = module->allocator;
  pVVar3->typeID = 0;
  pVVar3->source = (SynBase *)0x0;
  (pVVar3->comment).begin = (char *)0x0;
  (pVVar3->type).type = VM_TYPE_VOID;
  (pVVar3->type).size = 0;
  (pVVar3->type).structType = (TypeBase *)0x0;
  (pVVar3->comment).end = (char *)0x0;
  (pVVar3->users).allocator = pAVar1;
  (pVVar3->users).data = (pVVar3->users).little;
  (pVVar3->users).count = 0;
  (pVVar3->users).max = 8;
  pVVar3->hasSideEffects = false;
  pVVar3->hasMemoryAccess = false;
  pVVar3->canBeRemoved = true;
  pVVar3->hasKnownSimpleUse = false;
  pVVar3->hasKnownNonSimpleUse = false;
  pVVar3->_vptr_VmValue = (_func_int **)&PTR__VmValue_0022ac70;
  pVVar3 = anon_unknown.dwarf_10d873::CheckType(ctx,&node->super_ExprBase,pVVar3);
  return pVVar3;
}

Assistant:

VmValue* CompileVmContinue(ExpressionContext &ctx, VmModule *module, ExprContinue *node)
{
	if(node->closures)
		CompileVm(ctx, module, node->closures);

	VmBlock *target = GetLoopContinueBlock(module, node->depth);

	CreateJump(module, node->source, target);

	return CheckType(ctx, node, CreateVoid(module));
}